

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

MapValueRef * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,key_type *key)

{
  Value *ppvVar1;
  Value pvVar2;
  
  ppvVar1 = InnerMap::operator[](this->elements_,key);
  pvVar2 = *ppvVar1;
  if (pvVar2 == (Value)0x0) {
    pvVar2 = CreateValueTypeInternal(this,key);
    *ppvVar1 = pvVar2;
  }
  return &pvVar2->second;
}

Assistant:

T& operator[](const key_type& key) {
    value_type** value = &(*elements_)[key];
    if (*value == NULL) {
      *value = CreateValueTypeInternal(key);
      internal::MapValueInitializer<is_proto_enum<T>::value, T>::Initialize(
          (*value)->second, default_enum_value_);
    }
    return (*value)->second;
  }